

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_add_range_open_64(void **param_1)

{
  ulong uVar1;
  bool bVar2;
  uint32_t v;
  uint32_t x;
  pointer ppVar3;
  uint64_t v_1;
  ulong min;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> __l;
  Roaring64Map r2;
  Roaring64Map r1;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ranges;
  Roaring64Map local_c8;
  pointer local_90;
  Roaring64Map local_88;
  undefined8 local_50;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_48;
  
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_88.roarings._M_t._M_impl._0_8_ = 0;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._48_8_ = local_88._48_8_ & 0xffffffffffffff00;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  roaring::Roaring64Map::addRangeClosed(&local_88,1,4);
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.roarings._M_t._M_impl._0_8_ = 0;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.copyOnWrite = false;
  x = 1;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    roaring::Roaring64Map::add(&local_c8,x);
    x = x + 1;
  } while (x != 5);
  bVar2 = roaring::Roaring64Map::operator==(&local_88,&local_c8);
  _assert_true((ulong)bVar2,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x395);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_c8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_88);
  local_88.roarings._M_t._M_impl._0_8_ = 0x100000000;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 10;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0xfffffff6;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x10000000a;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x100000064;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x100000064;
  local_88._48_8_ = 0x100000002;
  local_50 = 0xfffffffe;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_88;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_c8);
  local_90 = local_48.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar3 = local_48.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      min = ppVar3->first;
      uVar1 = ppVar3->second;
      local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_88.roarings._M_t._M_impl._0_8_ = 0;
      local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
      local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_88._48_8_ = local_88._48_8_ & 0xffffffffffffff00;
      local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (min < uVar1) {
        roaring::Roaring64Map::addRangeClosed(&local_88,min,uVar1 - 1);
        local_c8.roarings._M_t._M_impl._0_8_ = 0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c8.copyOnWrite = false;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          roaring::Roaring64Map::add(&local_c8,min);
          min = min + 1;
        } while (uVar1 != min);
      }
      else {
        local_c8.roarings._M_t._M_impl._0_8_ = 0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c8.copyOnWrite = false;
        local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      bVar2 = roaring::Roaring64Map::operator==(&local_88,&local_c8);
      _assert_true((ulong)bVar2,"r1 == r2",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                   ,0x3a6);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                   *)&local_c8);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                   *)&local_88);
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != local_90);
  }
  if (local_48.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }